

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O0

gradient_t * __thiscall tensor_t<gradient_t>::get(tensor_t<gradient_t> *this,int _x,int _y,int _z)

{
  reference pvVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<gradient_t,_std::allocator<gradient_t>_> *in_RDI;
  bool bVar2;
  
  bVar2 = false;
  if ((-1 < in_ESI) && (bVar2 = false, -1 < in_EDX)) {
    bVar2 = -1 < in_ECX;
  }
  if (!bVar2) {
    __assert_fail("_x >= 0 && _y >= 0 && _z >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/tensor_t.h"
                  ,0x31,"T &tensor_t<gradient_t>::get(int, int, int) [T = gradient_t]");
  }
  bVar2 = false;
  if ((in_ESI < *(int *)&in_RDI[1].super__Vector_base<gradient_t,_std::allocator<gradient_t>_>.
                         _M_impl.super__Vector_impl_data._M_start) &&
     (bVar2 = false,
     in_EDX < *(int *)((long)&in_RDI[1].super__Vector_base<gradient_t,_std::allocator<gradient_t>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4))) {
    bVar2 = in_ECX < *(int *)&in_RDI[1].super__Vector_base<gradient_t,_std::allocator<gradient_t>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (!bVar2) {
    __assert_fail("_x < size.x && _y < size.y && _z < size.z",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/tensor_t.h"
                  ,0x32,"T &tensor_t<gradient_t>::get(int, int, int) [T = gradient_t]");
  }
  pvVar1 = std::vector<gradient_t,_std::allocator<gradient_t>_>::operator[]
                     (in_RDI,(long)(in_ECX * *(int *)&in_RDI[1].
                                                                                                            
                                                  super__Vector_base<gradient_t,_std::allocator<gradient_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start *
                                             *(int *)((long)&in_RDI[1].
                                                                                                                          
                                                  super__Vector_base<gradient_t,_std::allocator<gradient_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                    in_EDX * *(int *)&in_RDI[1].
                                                                                                            
                                                  super__Vector_base<gradient_t,_std::allocator<gradient_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + in_ESI
                                   ));
  return pvVar1;
}

Assistant:

T &get(int _x, int _y, int _z) {
    assert(_x >= 0 && _y >= 0 && _z >= 0);
    assert(_x < size.x && _y < size.y && _z < size.z);

    return data[
        _z * (size.x * size.y) +
            _y * (size.x) +
            _x
    ];
  }